

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

string * __thiscall
libcellml::Printer::PrinterImpl::printEncapsulation
          (string *__return_storage_ptr__,PrinterImpl *this,ComponentPtr *component,IdList *idList,
          bool autoIds)

{
  byte bVar1;
  element_type *peVar2;
  ulong uVar3;
  ComponentEntity local_1c8;
  string local_1b8;
  ulong local_198;
  size_t i;
  size_t componentCount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_52;
  undefined1 local_51;
  undefined1 local_50 [8];
  string componentName;
  bool autoIds_local;
  IdList *idList_local;
  ComponentPtr *component_local;
  PrinterImpl *this_local;
  string *repr;
  
  componentName.field_2._M_local_buf[0xf] = autoIds;
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  NamedEntity::name_abi_cxx11_((string *)local_50,(NamedEntity *)peVar2);
  local_51 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"<component_ref",&local_52);
  std::allocator<char>::~allocator(&local_52);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_a8," component=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(&local_88,&local_a8,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  ComponentEntity::encapsulationId_abi_cxx11_(&local_c8,&peVar2->super_ComponentEntity);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_c8);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    if ((componentName.field_2._M_local_buf[0xf] & 1U) != 0) {
      makeUniqueId((string *)&componentCount,idList);
      std::operator+(&local_168," id=\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &componentCount);
      std::operator+(&local_148,&local_168,"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&componentCount);
    }
  }
  else {
    peVar2 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    ComponentEntity::encapsulationId_abi_cxx11_(&local_128,&peVar2->super_ComponentEntity);
    std::operator+(&local_108," id=\"",&local_128);
    std::operator+(&local_e8,&local_108,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  i = ComponentEntity::componentCount(&peVar2->super_ComponentEntity);
  if (i == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/>");
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">");
  }
  for (local_198 = 0; local_198 < i; local_198 = local_198 + 1) {
    peVar2 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    ComponentEntity::component(&local_1c8,(size_t)peVar2);
    printEncapsulation(&local_1b8,this,(ComponentPtr *)&local_1c8,idList,
                       (bool)(componentName.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_1c8);
  }
  if (i != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"</component_ref>");
  }
  local_51 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Printer::PrinterImpl::printEncapsulation(const ComponentPtr &component, IdList &idList, bool autoIds)
{
    std::string componentName = component->name();
    std::string repr = "<component_ref";
    if (!componentName.empty()) {
        repr += " component=\"" + componentName + "\"";
    }
    if (!component->encapsulationId().empty()) {
        repr += " id=\"" + component->encapsulationId() + "\"";
    } else if (autoIds) {
        repr += " id=\"" + makeUniqueId(idList) + "\"";
    }
    size_t componentCount = component->componentCount();
    if (componentCount > 0) {
        repr += ">";
    } else {
        repr += "/>";
    }
    for (size_t i = 0; i < componentCount; ++i) {
        repr += printEncapsulation(component->component(i), idList, autoIds);
    }
    if (componentCount > 0) {
        repr += "</component_ref>";
    }
    return repr;
}